

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  uint uVar2;
  bool bVar3;
  undefined8 uVar4;
  reference __lhs;
  char *pcVar5;
  LinkEntry *lei;
  iterator __end1;
  iterator __begin1;
  EntryVector *__range1;
  int count;
  char space [3];
  cmComputeLinkDepends *this_local;
  
  pFVar1 = _stderr;
  _count = this;
  cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"target [%s] links to:\n",uVar4);
  __range1._5_1_ = ' ';
  __range1._6_1_ = ' ';
  __range1._7_1_ = 0;
  __range1._0_4_ = 2;
  __end1 = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::begin(&this->FinalLinkEntries);
  lei = (LinkEntry *)
        std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        end(&this->FinalLinkEntries);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
                                     *)&lei), bVar3) {
    __lhs = __gnu_cxx::
            __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
            ::operator*(&__end1);
    uVar2 = (uint)__range1;
    pFVar1 = _stderr;
    if (__lhs->Kind == Group) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"<LINK_GROUP>");
      pcVar5 = "end";
      if (bVar3) {
        pcVar5 = "start";
      }
      fprintf(pFVar1,"  %s group",pcVar5);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"<LINK_GROUP>");
      __range1._0_4_ = 2;
      if (bVar3) {
        __range1._0_4_ = 4;
      }
    }
    else if (__lhs->Target == (cmGeneratorTarget *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%*sitem [%s]",(ulong)uVar2,(long)&__range1 + 5,uVar4);
    }
    else {
      cmGeneratorTarget::GetName_abi_cxx11_(__lhs->Target);
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%*starget [%s]",(ulong)uVar2,(long)&__range1 + 5,uVar4);
    }
    bVar3 = std::operator!=(&__lhs->Feature,&cmLinkItem::DEFAULT_abi_cxx11_);
    pFVar1 = _stderr;
    if (bVar3) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,", feature [%s]",uVar4);
    }
    fprintf(_stderr,"\n");
    __gnu_cxx::
    __normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
    ::operator++(&__end1);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  char space[] = "  ";
  int count = 2;
  for (LinkEntry const& lei : this->FinalLinkEntries) {
    if (lei.Kind == LinkEntry::Group) {
      fprintf(stderr, "  %s group",
              lei.Item.Value == "<LINK_GROUP>" ? "start" : "end");
      count = lei.Item.Value == "<LINK_GROUP>" ? 4 : 2;
    } else if (lei.Target) {
      fprintf(stderr, "%*starget [%s]", count, space,
              lei.Target->GetName().c_str());
    } else {
      fprintf(stderr, "%*sitem [%s]", count, space, lei.Item.Value.c_str());
    }
    if (lei.Feature != LinkEntry::DEFAULT) {
      fprintf(stderr, ", feature [%s]", lei.Feature.c_str());
    }
    fprintf(stderr, "\n");
  }
  fprintf(stderr, "\n");
}